

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

arena_t * arena_init_locked(tsdn_t *tsdn,uint ind,arena_config_t *config)

{
  int8_t *piVar1;
  _Bool _Var2;
  dss_prec_t dVar3;
  base_t *base;
  arena_t *arena;
  ehooks_t *peVar4;
  arena_t *paVar5;
  char *pcVar6;
  arena_t *paVar7;
  arena_t *paVar8;
  ulong uVar9;
  ulong uVar10;
  nstime_t nStack_70;
  hpa_shard_opts_t hStack_68;
  
  if (0xffe < ind) {
    return (arena_t *)0x0;
  }
  if (narenas_total.repr == ind) {
    LOCK();
    narenas_total.repr = narenas_total.repr + 1;
    UNLOCK();
  }
  if ((arena_t *)duckdb_je_arenas[ind].repr != (arena_t *)0x0) {
    return (arena_t *)duckdb_je_arenas[ind].repr;
  }
  if (ind == 0) {
    base = duckdb_je_b0get();
  }
  else {
    base = duckdb_je_base_new(tsdn,ind,config->extent_hooks,config->metadata_use_hooks);
    if (base == (base_t *)0x0) {
      return (arena_t *)0x0;
    }
  }
  arena = (arena_t *)
          duckdb_je_base_alloc
                    (tsdn,base,
                     (ulong)duckdb_je_bin_info_nbatched_bins * 0x288 +
                     (ulong)duckdb_je_bin_info_nunbatched_bins * 0x100 + 0x134c0,0x40);
  if (arena != (arena_t *)0x0) {
    arena->nthreads[0].repr = 0;
    arena->nthreads[1].repr = 0;
    arena->last_thd = (tsdn_t *)0x0;
    (arena->tcache_ql).qlh_first = (tcache_slow_t *)0x0;
    (arena->cache_bin_array_descriptor_ql).qlh_first = (cache_bin_array_descriptor_t *)0x0;
    _Var2 = duckdb_je_malloc_mutex_init
                      (&arena->tcache_ql_mtx,"tcache_ql",WITNESS_RANK_TCACHE_QL,
                       malloc_mutex_rank_exclusive);
    if (!_Var2) {
      dVar3 = duckdb_je_extent_dss_prec_get();
      (arena->dss_prec).repr = dVar3;
      (arena->large).head.qlh_first = (edata_t *)0x0;
      _Var2 = duckdb_je_malloc_mutex_init
                        (&arena->large_mtx,"arena_large",WITNESS_RANK_ARENA_LARGE,
                         malloc_mutex_rank_exclusive);
      if (!_Var2) {
        duckdb_je_nstime_init_update(&nStack_70);
        _Var2 = duckdb_je_pa_shard_init
                          (tsdn,&arena->pa_shard,&duckdb_je_arena_pa_central_global,
                           &duckdb_je_arena_emap_global,base,ind,&(arena->stats).pa_shard_stats,
                           (malloc_mutex_t *)0x0,&nStack_70,duckdb_je_oversize_threshold,
                           dirty_decay_ms_default.repr,muzzy_decay_ms_default.repr);
        if (!_Var2) {
          (arena->binshard_next).repr = 0;
          for (uVar10 = 0; uVar9 = 0xffffffffffffffff, uVar10 != 0x24; uVar10 = uVar10 + 1) {
            paVar5 = arena;
            paVar7 = arena;
            while (uVar9 = uVar9 + 1, uVar9 < duckdb_je_bin_infos[uVar10].n_shards) {
              paVar8 = paVar7;
              if (uVar10 < duckdb_je_bin_info_nbatched_sizes) {
                paVar8 = paVar5;
              }
              _Var2 = duckdb_je_bin_init((bin_t *)((long)&paVar8->nthreads[0].repr +
                                                  (ulong)duckdb_je_arena_bin_offsets[uVar10]),
                                         (uint)uVar10);
              paVar5 = (arena_t *)&(paVar5->stats).mutex_prof_data[6].n_owner_switches;
              paVar7 = (arena_t *)&(paVar7->stats).mutex_prof_data[0].max_n_thds;
              if (_Var2) goto LAB_00e56204;
            }
          }
          arena->base = base;
          duckdb_je_arena_set(ind,arena);
          arena->ind = ind;
          pcVar6 = "manual";
          if (ind < duckdb_je_manual_arena_base) {
            pcVar6 = "auto";
          }
          duckdb_je_malloc_snprintf(arena->name,0x20,"%s_%u",pcVar6,(ulong)ind);
          arena->name[0x1f] = '\0';
          duckdb_je_nstime_init_update(&arena->create_time);
          if (duckdb_je_opt_hpa == true) {
            peVar4 = duckdb_je_base_ehooks_get(base);
            if ((ind != 0) &&
               ((extent_hooks_t *)(peVar4->ptr).repr == &duckdb_je_ehooks_default_extent_hooks)) {
              hStack_68.min_purge_interval_ms = duckdb_je_opt_hpa_opts.min_purge_interval_ms;
              hStack_68.strict_min_purge_interval = duckdb_je_opt_hpa_opts.strict_min_purge_interval
              ;
              hStack_68._41_7_ = duckdb_je_opt_hpa_opts._41_7_;
              hStack_68.hugify_delay_ms = duckdb_je_opt_hpa_opts.hugify_delay_ms;
              hStack_68.slab_max_alloc = duckdb_je_opt_hpa_opts.slab_max_alloc;
              hStack_68.hugification_threshold = duckdb_je_opt_hpa_opts.hugification_threshold;
              hStack_68._21_3_ = duckdb_je_opt_hpa_opts._21_3_;
              hStack_68.dirty_mult = duckdb_je_opt_hpa_opts.dirty_mult;
              hStack_68._16_8_ =
                   CONCAT35(hStack_68._21_3_,
                            CONCAT14(duckdb_je_background_thread_enabled_state.repr,
                                     hStack_68.dirty_mult)) & 0xffffff01ffffffff;
              _Var2 = duckdb_je_pa_shard_enable_hpa
                                (tsdn,&arena->pa_shard,&hStack_68,&duckdb_je_opt_hpa_sec_opts);
              if (!_Var2) goto LAB_00e5639b;
              goto LAB_00e5620b;
            }
          }
          if (ind == 0) {
            return arena;
          }
LAB_00e5639b:
          piVar1 = &(tsdn->tsd).
                    cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
          *piVar1 = *piVar1 + '\x01';
          if ((tsdn->tsd).state.repr == '\0') {
            duckdb_je_tsd_slow_update(&tsdn->tsd);
          }
          if (duckdb_je_test_hooks_arena_new_hook != (_func_void *)0x0) {
            (*duckdb_je_test_hooks_arena_new_hook)();
          }
          piVar1 = &(tsdn->tsd).
                    cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == '\0') {
            duckdb_je_tsd_slow_update(&tsdn->tsd);
            return arena;
          }
          return arena;
        }
      }
    }
  }
LAB_00e56204:
  if (ind == 0) {
    return (arena_t *)0x0;
  }
LAB_00e5620b:
  duckdb_je_base_delete(tsdn,base);
  return (arena_t *)0x0;
}

Assistant:

static arena_t *
arena_init_locked(tsdn_t *tsdn, unsigned ind, const arena_config_t *config) {
	arena_t *arena;

	assert(ind <= narenas_total_get());
	if (ind >= MALLOCX_ARENA_LIMIT) {
		return NULL;
	}
	if (ind == narenas_total_get()) {
		narenas_total_inc();
	}

	/*
	 * Another thread may have already initialized arenas[ind] if it's an
	 * auto arena.
	 */
	arena = arena_get(tsdn, ind, false);
	if (arena != NULL) {
		assert(arena_is_auto(arena));
		return arena;
	}

	/* Actually initialize the arena. */
	arena = arena_new(tsdn, ind, config);

	return arena;
}